

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::anon_unknown_69::WindowFlowController::WindowFlowController
          (WindowFlowController *this,WindowGetter *windowGetter)

{
  SourceLocation location;
  
  (this->super_RpcFlowController)._vptr_RpcFlowController = (_func_int **)&PTR_send_006fbaa8;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_006fbad0;
  this->windowGetter = windowGetter;
  (this->emptyFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->emptyFulfiller).ptr.ptr = (PromiseFulfiller<kj::Promise<void>_> *)0x0;
  this->inFlight = 0;
  this->maxMessageSize = 0;
  (this->state).tag = 0;
  location.function = "WindowFlowController";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  location.lineNumber = 0x123b;
  location.columnNumber = 0x25;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler,location);
  if ((this->state).tag != 0) {
    kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>::
    destroy(&this->state);
  }
  *(undefined8 *)((long)&(this->state).field_1 + 0x10) = 0;
  *(undefined8 *)((long)&(this->state).field_1 + 0x18) = 0;
  *(undefined8 *)&(this->state).field_1 = 0;
  *(undefined8 *)((long)&(this->state).field_1 + 8) = 0;
  *(undefined8 **)((long)&(this->state).field_1 + 0x18) = &kj::NullArrayDisposer::instance;
  (this->state).tag = 1;
  return;
}

Assistant:

WindowFlowController(RpcFlowController::WindowGetter& windowGetter)
      : windowGetter(windowGetter), tasks(*this) {
    state.init<Running>();
  }